

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall kj::Promise<siginfo_t>::wait(Promise<siginfo_t> *this,void *__stat_loc)

{
  long lVar1;
  WaitScope *in_RDX;
  anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *paVar2;
  PromiseBase *pPVar3;
  byte bVar4;
  ExceptionOr<siginfo_t> result;
  
  bVar4 = 0;
  result.super_ExceptionOrValue.exception.ptr.isSet = false;
  result.value.ptr.isSet = false;
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&result.super_ExceptionOrValue,in_RDX);
  if (result.value.ptr.isSet == true) {
    if (result.super_ExceptionOrValue.exception.ptr.isSet != false) {
      throwRecoverableException(&result.super_ExceptionOrValue.exception.ptr.field_1.value,0);
    }
    lVar1 = 0x10;
    paVar2 = &result.value.ptr.field_1;
    pPVar3 = &this->super_PromiseBase;
    for (; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pPVar3 = *(undefined8 *)paVar2;
      paVar2 = (anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *)
               ((long)paVar2 + (ulong)bVar4 * -0x10 + 8);
      pPVar3 = (PromiseBase *)((long)pPVar3 + ((ulong)bVar4 * 0xfffffffffffffffe + 1) * 8);
    }
    _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&result);
    return (__pid_t)this;
  }
  if (result.super_ExceptionOrValue.exception.ptr.isSet != false) {
    throwFatalException(&result.super_ExceptionOrValue.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }